

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QHash<int,_QVariant>_>::resize(QList<QHash<int,_QVariant>_> *this,qsizetype size)

{
  resize_internal(this,size);
  if ((this->d).size < size) {
    QArrayDataPointer<QHash<int,_QVariant>_>::appendInitialize(&this->d,size);
    return;
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }